

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<float,_4,_1,_0,_4,_1> *dst,SrcXprType *src,assign_op<float,_float> *param_3)

{
  Index rows;
  Index cols;
  Index IVar1;
  LhsNestedCleaned *lhs;
  RhsNestedCleaned *rhs;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  SrcXprType *src_local;
  Matrix<float,_4,_1,_0,_4,_1> *dst_local;
  
  rows = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
         ::rows(src);
  cols = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
         ::cols(src);
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>);
  if (IVar1 == rows) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>);
    if (IVar1 == cols) goto LAB_002c09ed;
  }
  PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,rows,cols);
LAB_002c09ed:
  lhs = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
        ::lhs(src);
  rhs = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
        ::rhs(src);
  generic_product_impl<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>,Eigen::Matrix<float,3,1,0,3,1>,Eigen::DenseShape,Eigen::DenseShape,3>
  ::evalTo<Eigen::Matrix<float,4,1,0,4,1>>(dst,lhs,rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }